

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFElemStack::~WFElemStack(WFElemStack *this)

{
  XMLCh *p;
  ulong local_18;
  XMLSize_t stackInd;
  WFElemStack *this_local;
  
  for (local_18 = 0;
      (local_18 < this->fStackCapacity && (this->fStack[local_18] != (StackElem *)0x0));
      local_18 = local_18 + 1) {
    p = this->fStack[local_18]->fThisElement;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    if (this->fStack[local_18] != (StackElem *)0x0) {
      XMemory::operator_delete((XMemory *)this->fStack[local_18],p);
    }
  }
  if (this->fMap != (PrefMapElem *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fMap);
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fStack);
  XMLStringPool::~XMLStringPool(&this->fPrefixPool);
  return;
}

Assistant:

WFElemStack::~WFElemStack()
{
    //
    //  Start working from the bottom of the stack and clear it out as we
    //  go up. Once we hit an uninitialized one, we can break out.
    //
    for (XMLSize_t stackInd = 0; stackInd < fStackCapacity; stackInd++)
    {
        // If this entry has been set, then lets clean it up
        if (!fStack[stackInd])
            break;

        fMemoryManager->deallocate(fStack[stackInd]->fThisElement);//delete [] fStack[stackInd]->fThisElement;
        delete fStack[stackInd];
    }

    if (fMap)
        fMemoryManager->deallocate(fMap);//delete [] fMap;

    // Delete the stack array itself now
    fMemoryManager->deallocate(fStack);//delete [] fStack;
}